

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

int fl_wait(double time_to_wait)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  FD *pFVar5;
  ushort uVar6;
  int iVar7;
  fd_set *pfVar8;
  fd_set *pfVar9;
  timeval *__timeout;
  ulong uVar10;
  ushort uVar11;
  long lVar12;
  bool bVar13;
  byte bVar14;
  timeval t;
  fd_set fdt [3];
  timeval local_1a8;
  fd_set local_198;
  fd_set local_118;
  fd_set fStack_98;
  
  bVar14 = 0;
  if ((fl_display != (Display *)0x0) && (iVar2 = XQLength(), iVar2 != 0)) {
    do_queued_events();
    return 1;
  }
  pfVar8 = fdsets;
  pfVar9 = &local_198;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pfVar9->fds_bits[0] = pfVar8->fds_bits[0];
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar14 * -2 + 1) * 8);
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pfVar8 = fdsets + 1;
  pfVar9 = &local_118;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pfVar9->fds_bits[0] = pfVar8->fds_bits[0];
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar14 * -2 + 1) * 8);
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pfVar8 = fdsets + 2;
  pfVar9 = &fStack_98;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pfVar9->fds_bits[0] = pfVar8->fds_bits[0];
    pfVar8 = (fd_set *)((long)pfVar8 + ((ulong)bVar14 * -2 + 1) * 8);
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  (*fl_unlock_function)();
  if (2147483.648 <= time_to_wait) {
    __timeout = (timeval *)0x0;
  }
  else {
    local_1a8.tv_sec = (__time_t)(int)time_to_wait;
    __timeout = &local_1a8;
    local_1a8.tv_usec = (__suseconds_t)(int)((time_to_wait - (double)(int)time_to_wait) * 1000000.0)
    ;
  }
  iVar2 = select(maxfd + 1,&local_198,&local_118,&fStack_98,__timeout);
  (*fl_lock_function)();
  if (0 < nfds && 0 < iVar2) {
    lVar4 = 0x10;
    lVar12 = 0;
    pFVar5 = fd;
    iVar3 = nfds;
    do {
      iVar1 = *(int *)((long)pFVar5 + lVar4 + -0x10);
      iVar7 = iVar1 + 0x3f;
      if (-1 < iVar1) {
        iVar7 = iVar1;
      }
      iVar7 = iVar7 >> 6;
      uVar10 = (ulong)(uint)(iVar1 % 0x40);
      bVar13 = ((ulong)local_198.fds_bits[iVar7] >> (uVar10 & 0x3f) & 1) != 0;
      uVar6 = bVar13 + 4;
      if (((ulong)local_118.fds_bits[iVar7] >> (uVar10 & 0x3f) & 1) == 0) {
        uVar6 = (ushort)bVar13;
      }
      uVar11 = uVar6 + 8;
      if (((ulong)fStack_98.fds_bits[iVar7] >> (uVar10 & 0x3f) & 1) == 0) {
        uVar11 = uVar6;
      }
      if ((*(ushort *)((long)pFVar5 + lVar4 + -0xc) & uVar11) != 0) {
        (**(code **)((long)pFVar5 + lVar4 + -8))(iVar1,*(undefined8 *)((long)&pFVar5->fd + lVar4));
        pFVar5 = fd;
        iVar3 = nfds;
      }
      lVar12 = lVar12 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar12 < iVar3);
  }
  return iVar2;
}

Assistant:

int fl_wait(double time_to_wait) {

  // OpenGL and other broken libraries call XEventsQueued
  // unnecessarily and thus cause the file descriptor to not be ready,
  // so we must check for already-read events:
  if (fl_display && XQLength(fl_display)) {do_queued_events(); return 1;}

#  if !USE_POLL
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
#  endif
  int n;

  fl_unlock_function();

  if (time_to_wait < 2147483.648) {
#  if USE_POLL
    n = ::poll(pollfds, nfds, int(time_to_wait*1000 + .5));
#  else
    timeval t;
    t.tv_sec = int(time_to_wait);
    t.tv_usec = int(1000000 * (time_to_wait-t.tv_sec));
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
  } else {
#  if USE_POLL
    n = ::poll(pollfds, nfds, -1);
#  else
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],0);
#  endif
  }

  fl_lock_function();

  if (n > 0) {
    for (int i=0; i<nfds; i++) {
#  if USE_POLL
      if (pollfds[i].revents) fd[i].cb(pollfds[i].fd, fd[i].arg);
#  else
      int f = fd[i].fd;
      short revents = 0;
      if (FD_ISSET(f,&fdt[0])) revents |= POLLIN;
      if (FD_ISSET(f,&fdt[1])) revents |= POLLOUT;
      if (FD_ISSET(f,&fdt[2])) revents |= POLLERR;
      if (fd[i].events & revents) fd[i].cb(f, fd[i].arg);
#  endif
    }
  }
  return n;
}